

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O2

void __thiscall
MeshLib::StringTokenizer::StringTokenizer(StringTokenizer *this,char *buffer,char *seperator)

{
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  bool bVar5;
  
  (this->m_tokens).m_head = (ListNode<char> *)0x0;
  (this->m_tokens).m_size = 0;
  sVar1 = strlen(buffer);
  if ((int)sVar1 != 0) {
    uVar3 = 0;
    if (0 < (int)sVar1) {
      uVar3 = sVar1 & 0xffffffff;
    }
    pcVar4 = buffer + 1;
    while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
      pcVar2 = strchr(seperator,(int)pcVar4[-1]);
      if (pcVar2 != (char *)0x0) {
        pcVar4[-1] = '\0';
        List<char>::Append(&this->m_tokens,buffer);
        buffer = pcVar4;
      }
      pcVar4 = pcVar4 + 1;
    }
    List<char>::Append(&this->m_tokens,buffer);
  }
  return;
}

Assistant:

StringTokenizer::StringTokenizer( char * buffer, const char * seperator )
{

	char * pStr = NULL;

	int str_len = (int)strlen( buffer    );

	if( str_len == 0 ) return;

	pStr = buffer;

	for( int i = 0; i < str_len; i ++ )
	{
		char c = buffer[i];

		if( strchr( seperator, c ) )
		{
			buffer[i] = 0;
			m_tokens.Append( pStr );
			pStr = buffer+i+1;
		}
	
	}

	m_tokens.Append( pStr );
}